

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

abctime Saig_ManBmcTimeToStop(Saig_ParBmc_t *pPars,abctime nTimeToStopNG)

{
  int iVar1;
  abctime aVar2;
  abctime local_40;
  long local_30;
  abctime local_28;
  abctime nTimeToStop;
  abctime nTimeToStopGap;
  abctime nTimeToStopNG_local;
  Saig_ParBmc_t *pPars_local;
  
  if (pPars->nTimeOutGap == 0) {
    local_30 = 0;
  }
  else {
    iVar1 = pPars->nTimeOutGap;
    aVar2 = Abc_Clock();
    local_30 = (long)iVar1 * 1000000 + aVar2;
  }
  local_28 = 0;
  if ((nTimeToStopNG == 0) || (local_30 == 0)) {
    aVar2 = nTimeToStopNG;
    if ((nTimeToStopNG == 0) && (aVar2 = local_28, local_30 != 0)) {
      local_28 = local_30;
      aVar2 = local_28;
    }
  }
  else {
    local_40 = nTimeToStopNG;
    if (local_30 <= nTimeToStopNG) {
      local_40 = local_30;
    }
    local_28 = local_40;
    aVar2 = local_28;
  }
  local_28 = aVar2;
  return local_28;
}

Assistant:

abctime Saig_ManBmcTimeToStop( Saig_ParBmc_t * pPars, abctime nTimeToStopNG )
{
    abctime nTimeToStopGap = pPars->nTimeOutGap ? pPars->nTimeOutGap * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime nTimeToStop = 0;
    if ( nTimeToStopNG && nTimeToStopGap )
        nTimeToStop = nTimeToStopNG < nTimeToStopGap ? nTimeToStopNG : nTimeToStopGap;
    else if ( nTimeToStopNG )
        nTimeToStop = nTimeToStopNG;
    else if ( nTimeToStopGap )
        nTimeToStop = nTimeToStopGap;
    return nTimeToStop;
}